

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall CLOptions::DefineParams(CLOptions *this)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  string *name;
  reference pvVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  pointer ppVar12;
  size_type sVar13;
  long in_RDI;
  iterator siter;
  iterator iiter;
  iterator diter;
  iterator biter;
  int opt_num;
  int options_count;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb8;
  allocator *paVar14;
  pointer in_stack_fffffffffffffdc0;
  vector<option,_std::allocator<option>_> *in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffdd0;
  char val;
  pointer in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  uint has_arg;
  CLOptions *this_00;
  allocator local_1e1;
  string local_1e0 [32];
  char *local_1c0;
  undefined8 local_1b8;
  int *local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined8 local_198;
  int *local_190;
  undefined8 local_188;
  _Self local_180;
  _Base_ptr local_178;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  local_170;
  char *local_168;
  undefined8 local_160;
  int *local_158;
  undefined8 local_150;
  _Self local_148;
  _Base_ptr local_140;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  local_138;
  char *local_130;
  undefined8 local_128;
  int *local_120;
  undefined8 local_118;
  _Self local_110;
  _Base_ptr local_108;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  local_100;
  char *local_f8;
  undefined8 local_f0;
  int *local_e8;
  undefined8 local_e0;
  _Self local_d8;
  _Base_ptr local_d0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  local_c8;
  char *local_c0;
  undefined8 local_b8;
  int *local_b0;
  undefined8 local_a8;
  string local_a0 [32];
  char *local_80;
  undefined8 local_78;
  int *local_70;
  undefined8 local_68;
  int local_60;
  undefined1 local_49 [61];
  int local_c;
  
  std::vector<option,_std::allocator<option>_>::clear
            ((vector<option,_std::allocator<option>_> *)0x11e115);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                  *)0x11e123);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                  *)0x11e136);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                  *)0x11e157);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                  *)0x11e178);
  local_c = (int)sVar4 + (int)sVar5 + (int)sVar6 + (int)sVar7 + 2;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName(in_stack_fffffffffffffdb8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)(local_49 + 0x19));
  if (((bVar1 ^ 0xff) & 1) != 0) {
    local_c = local_c + 1;
  }
  name = (string *)(long)local_c;
  this_00 = (CLOptions *)local_49;
  std::allocator<option>::allocator((allocator<option> *)0x11e201);
  std::vector<option,_std::allocator<option>_>::vector
            ((vector<option,_std::allocator<option>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (size_type)in_stack_fffffffffffffdd8,(allocator_type *)in_stack_fffffffffffffdd0);
  std::vector<option,_std::allocator<option>_>::operator=
            ((vector<option,_std::allocator<option>_> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  std::vector<option,_std::allocator<option>_>::~vector
            ((vector<option,_std::allocator<option>_> *)in_stack_fffffffffffffdd0);
  std::allocator<option>::~allocator((allocator<option> *)0x11e24a);
  local_60 = 0;
  DefineOptSingle(this_00,name,in_stack_fffffffffffffde4,(int *)in_stack_fffffffffffffdd8,
                  (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
  sVar13 = (size_type)local_60;
  local_60 = local_60 + 1;
  pvVar8 = std::vector<option,_std::allocator<option>_>::operator[]
                     ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),sVar13);
  pvVar8->name = local_80;
  *(undefined8 *)&pvVar8->has_arg = local_78;
  pvVar8->flag = local_70;
  *(undefined8 *)&pvVar8->val = local_68;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName(in_stack_fffffffffffffdb8);
  uVar2 = std::__cxx11::string::empty();
  has_arg = CONCAT13(uVar2,(int3)in_stack_fffffffffffffde4) ^ 0xff000000;
  std::__cxx11::string::~string(local_a0);
  if ((has_arg & 0x1000000) != 0) {
    DefineOptSingle(this_00,name,has_arg,(int *)in_stack_fffffffffffffdd8,
                    (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
    sVar13 = (size_type)local_60;
    local_60 = local_60 + 1;
    pvVar8 = std::vector<option,_std::allocator<option>_>::operator[]
                       ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),sVar13);
    pvVar8->name = local_c0;
    *(undefined8 *)&pvVar8->has_arg = local_b8;
    pvVar8->flag = local_b0;
    *(undefined8 *)&pvVar8->val = local_a8;
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  ::_Rb_tree_iterator(&local_c8);
  local_d0 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                      *)in_stack_fffffffffffffdb8);
  local_c8._M_node = local_d0;
  while( true ) {
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                *)in_stack_fffffffffffffdb8);
    bVar3 = std::operator!=(&local_c8,&local_d8);
    if (!bVar3) break;
    in_stack_fffffffffffffdd8 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
         ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                       *)0x11e42f);
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                           *)0x11e441);
    CLParam<bool>::getShortParamName((CLParam<bool> *)ppVar9->second);
    DefineOptSingle(this_00,name,has_arg,(int *)in_stack_fffffffffffffdd8,
                    (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
    sVar13 = (size_type)local_60;
    local_60 = local_60 + 1;
    pvVar8 = std::vector<option,_std::allocator<option>_>::operator[]
                       ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),sVar13);
    pvVar8->name = local_f8;
    *(undefined8 *)&pvVar8->has_arg = local_f0;
    pvVar8->flag = local_e8;
    *(undefined8 *)&pvVar8->val = local_e0;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                  *)in_stack_fffffffffffffdc0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  ::_Rb_tree_iterator(&local_100);
  local_108 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                       *)in_stack_fffffffffffffdb8);
  local_100._M_node = local_108;
  while( true ) {
    local_110._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                *)in_stack_fffffffffffffdb8);
    bVar3 = std::operator!=(&local_100,&local_110);
    if (!bVar3) break;
    in_stack_fffffffffffffdd0 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
         ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                       *)0x11e546);
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                            *)0x11e558);
    CLParam<double>::getShortParamName(&ppVar10->second->super_CLParam<double>);
    DefineOptSingle(this_00,name,has_arg,(int *)in_stack_fffffffffffffdd8,
                    (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
    sVar13 = (size_type)local_60;
    local_60 = local_60 + 1;
    pvVar8 = std::vector<option,_std::allocator<option>_>::operator[]
                       ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),sVar13);
    pvVar8->name = local_130;
    *(undefined8 *)&pvVar8->has_arg = local_128;
    pvVar8->flag = local_120;
    *(undefined8 *)&pvVar8->val = local_118;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                  *)in_stack_fffffffffffffdc0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  ::_Rb_tree_iterator(&local_138);
  local_140 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                       *)in_stack_fffffffffffffdb8);
  local_138._M_node = local_140;
  while( true ) {
    local_148._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                *)in_stack_fffffffffffffdb8);
    bVar3 = std::operator!=(&local_138,&local_148);
    if (!bVar3) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                  *)0x11e663);
    ppVar11 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                            *)0x11e675);
    CLParam<int>::getShortParamName((CLParam<int> *)ppVar11->second);
    DefineOptSingle(this_00,name,has_arg,(int *)in_stack_fffffffffffffdd8,
                    (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
    sVar13 = (size_type)local_60;
    local_60 = local_60 + 1;
    pvVar8 = std::vector<option,_std::allocator<option>_>::operator[]
                       ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),sVar13);
    pvVar8->name = local_168;
    *(undefined8 *)&pvVar8->has_arg = local_160;
    pvVar8->flag = local_158;
    *(undefined8 *)&pvVar8->val = local_150;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                  *)in_stack_fffffffffffffdc0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  ::_Rb_tree_iterator(&local_170);
  local_178 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                       *)in_stack_fffffffffffffdb8);
  local_170._M_node = local_178;
  while( true ) {
    local_180._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                *)in_stack_fffffffffffffdb8);
    bVar3 = std::operator!=(&local_170,&local_180);
    val = (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
    if (!bVar3) break;
    in_stack_fffffffffffffdc0 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
         ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                       *)0x11e780);
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                            *)0x11e792);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getShortParamName(&ppVar12->second->
                       super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     );
    DefineOptSingle(this_00,name,has_arg,(int *)in_stack_fffffffffffffdd8,
                    (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38));
    sVar13 = (size_type)local_60;
    local_60 = local_60 + 1;
    pvVar8 = std::vector<option,_std::allocator<option>_>::operator[]
                       ((vector<option,_std::allocator<option>_> *)(in_RDI + 8),sVar13);
    pvVar8->name = local_1a0;
    *(undefined8 *)&pvVar8->has_arg = local_198;
    pvVar8->flag = local_190;
    *(undefined8 *)&pvVar8->val = local_188;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                  *)in_stack_fffffffffffffdc0);
  }
  paVar14 = &local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"",paVar14);
  DefineOptSingle(this_00,name,has_arg,(int *)in_stack_fffffffffffffdd8,val);
  pvVar8 = std::vector<option,_std::allocator<option>_>::back
                     ((vector<option,_std::allocator<option>_> *)in_stack_fffffffffffffdc0);
  pvVar8->name = local_1c0;
  *(undefined8 *)&pvVar8->has_arg = local_1b8;
  pvVar8->flag = local_1b0;
  *(undefined8 *)&pvVar8->val = local_1a8;
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  return;
}

Assistant:

void CLOptions::DefineParams()
{
    // Clear out the longopts object
    longopts.clear() ;
    
    // Resize it to hold exactly the number of variables we need
    int options_count = params_bools.size() +
                        params_doubles.size() +
                        params_ints.size() +
                        params_strings.size() + 2 ;
    if (!version_opt.getParamName().empty()) options_count++ ;
    
    longopts = std::vector<struct option>(options_count) ;
    int opt_num(0) ;
    
    // Add the help option
    longopts[opt_num++] = DefineOptSingle(help_str, no_argument, 0, 'h') ;
    
    // Add the version information if so requested
    if (!version_opt.getParamName().empty()) {
        longopts[opt_num++] = DefineOptSingle(version_str, no_argument, 0, 'v') ;
    }
    
    // Add the bool options
    std::map<std::string, CLBool*>::iterator biter ;
    for (biter=params_bools.begin(); biter!=params_bools.end(); ++biter) {
        longopts[opt_num++] = DefineOptSingle(biter->first, required_argument, 0,
                                              biter->second->getShortParamName()) ;
    }
    
    // Add the double options
    std::map<std::string, CLDouble*>::iterator diter ;
    for (diter=params_doubles.begin(); diter!=params_doubles.end(); ++diter) {
        longopts[opt_num++] = DefineOptSingle(diter->first, required_argument, 0, 
                                              diter->second->getShortParamName()) ;
    }
    
    // Add the int options
    std::map<std::string, CLInt*>::iterator iiter ;
    for (iiter=params_ints.begin(); iiter!=params_ints.end(); ++iiter) {
        longopts[opt_num++] = DefineOptSingle(iiter->first, required_argument, 0, 
                                              iiter->second->getShortParamName()) ;
    }
    
    // Add the string options
    std::map<std::string, CLString*>::iterator siter ;
    for (siter=params_strings.begin(); siter!=params_strings.end(); ++siter) {
        longopts[opt_num++] = DefineOptSingle(siter->first, required_argument, 0, 
                                              siter->second->getShortParamName()) ;
    }
    
    // Add the terminating options
    longopts.back() = DefineOptSingle("",0,0,0) ;
}